

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_param_tests.hpp
# Opt level: O1

TestSuite * __thiscall
iutest::detail::ParamTestInstance<iu_FooP_x_iutest_x_DISABLED_Bar_Test>::MakeTestSuite
          (ParamTestInstance<iu_FooP_x_iutest_x_DISABLED_Bar_Test> *this,string *testsuite_name,
          TestTypeId id,SetUpMethod setup,TearDownMethod teardown)

{
  UnitTest *this_00;
  TestSuite *pTVar1;
  
  this_00 = UnitTest::instance();
  pTVar1 = UnitTestImpl::AddTestSuite<iutest::TestSuite>
                     (&this_00->super_UnitTestImpl,testsuite_name,id,setup,teardown);
  return pTVar1;
}

Assistant:

virtual TestSuite* MakeTestSuite(const ::std::string& testsuite_name, TestTypeId id
        , SetUpMethod setup, TearDownMethod teardown) const IUTEST_CXX_OVERRIDE
    {
#if !defined(IUTEST_NO_EXPLICIT_FUNCTION_TEMPLATE_ARGUMENTS)
        return UnitTest::instance().AddTestSuite<TestSuite>(testsuite_name, id, setup, teardown);
#else
        return UnitTest::instance().AddTestSuite(
            testsuite_name, id, setup, teardown, detail::explicit_type<TestSuite>());
#endif
    }